

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

void __thiscall
CFG::Block::AddBranchTo(Block *this,Block *Target,Expression *Condition,Expression *Code)

{
  bool bVar1;
  Branch *pBVar2;
  Branch **ppBVar3;
  Block *local_30;
  Block *Target_local;
  
  local_30 = Target;
  bVar1 = contains<wasm::InsertOrderedMap<CFG::Block*,CFG::Branch*>,CFG::Block*>
                    (&this->BranchesOut,&local_30);
  if (!bVar1) {
    pBVar2 = Relooper::AddBranch(this->relooper,Condition,Code);
    ppBVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                        (&this->BranchesOut,&local_30);
    *ppBVar3 = pBVar2;
    return;
  }
  __assert_fail("!contains(BranchesOut, Target)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                ,0x97,
                "void CFG::Block::AddBranchTo(Block *, wasm::Expression *, wasm::Expression *)");
}

Assistant:

void Block::AddBranchTo(Block* Target,
                        wasm::Expression* Condition,
                        wasm::Expression* Code) {
  // cannot add more than one branch to the same target
  assert(!contains(BranchesOut, Target));
  BranchesOut[Target] = relooper->AddBranch(Condition, Code);
}